

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> * __thiscall
OpenMD::SelectionSet::get(SelectionSet *this,vector<int,_std::allocator<int>_> *bitIndex)

{
  reference bitIndex_00;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RSI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  reference rVar1;
  int i;
  vector<bool,_std::allocator<bool>_> *result;
  allocator_type *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  reference local_40;
  int local_30;
  undefined1 local_19;
  
  local_19 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x3810c9);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
             ,in_stack_ffffffffffffff80);
  std::allocator<bool>::~allocator((allocator<bool> *)0x3810e9);
  for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
    bitIndex_00 = std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::
                  operator[](in_RSI,(long)local_30);
    std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_30);
    in_stack_ffffffffffffff97 =
         OpenMDBitSet::get((OpenMDBitSet *)
                           CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                           (size_t)bitIndex_00);
    rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDI,(size_type)in_RDX);
    local_40 = rVar1;
    std::_Bit_reference::operator=(&local_40,(bool)(in_stack_ffffffffffffff97 & 1));
  }
  return in_RDI;
}

Assistant:

std::vector<bool> SelectionSet::get(std::vector<int> bitIndex) {
    std::vector<bool> result(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].get(bitIndex[i]);
    return result;
  }